

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall kratos::IfStmt::set_else(IfStmt *this,shared_ptr<kratos::ScopedStmtBlock> *stmt)

{
  bool bVar1;
  element_type *peVar2;
  StmtBlock *pSVar3;
  reference stmt_00;
  shared_ptr<kratos::Stmt> *s;
  iterator __end2;
  iterator __begin2;
  element_type *__range2;
  shared_ptr<kratos::ScopedStmtBlock> *stmt_local;
  IfStmt *this_local;
  
  bVar1 = std::operator!=(&this->else_body_,stmt);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->else_body_);
    (*(peVar2->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xc])();
    pSVar3 = &std::
              __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)stmt)->super_StmtBlock;
    __end2 = StmtBlock::begin(pSVar3);
    s = (shared_ptr<kratos::Stmt> *)StmtBlock::end(pSVar3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                                       *)&s), bVar1) {
      stmt_00 = __gnu_cxx::
                __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                ::operator*(&__end2);
      pSVar3 = &std::
                __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->else_body_)->super_StmtBlock;
      StmtBlock::add_stmt(pSVar3,stmt_00);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void IfStmt::set_else(const std::shared_ptr<ScopedStmtBlock> &stmt) {
    if (else_body_ != stmt) {
        else_body_->clear();
        for (auto &s : *stmt) {
            else_body_->add_stmt(s);
        }
    }
}